

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O3

double orient2d(double *pa,double *pb,double *pc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dStack_1e0;
  double dStack_1a0;
  double dStack_190;
  double adStack_178 [4];
  double dStack_158;
  double dStack_150;
  double dStack_148;
  double adStack_140 [17];
  double adStack_b8 [8];
  double adStack_78 [12];
  
  dVar12 = splitter;
  dVar8 = (pb[1] - pc[1]) * (*pa - *pc);
  dVar9 = (*pb - *pc) * (pa[1] - pc[1]);
  dVar20 = dVar8 - dVar9;
  if (dVar8 <= 0.0) {
    if (0.0 <= dVar8) {
      return dVar20;
    }
    if (0.0 <= dVar9) {
      return dVar20;
    }
    dVar8 = -dVar8 - dVar9;
  }
  else {
    if (dVar9 <= 0.0) {
      return dVar20;
    }
    dVar8 = dVar8 + dVar9;
  }
  if ((dVar20 < ccwerrboundA * dVar8) && (-dVar20 < ccwerrboundA * dVar8)) {
    dVar30 = *pa;
    dVar31 = pa[1];
    dVar15 = *pc;
    dVar17 = pc[1];
    dVar24 = dVar30 - dVar15;
    dVar26 = dVar31 - dVar17;
    dVar7 = *pb;
    dVar14 = pb[1];
    dVar10 = dVar14 - dVar17;
    dVar11 = dVar7 - dVar15;
    dVar18 = splitter * dVar10 - (splitter * dVar10 - dVar10);
    dVar19 = splitter * dVar11 - (splitter * dVar11 - dVar11);
    dVar13 = dVar10 - dVar18;
    dVar16 = dVar11 - dVar19;
    dVar9 = dVar24 * splitter - (dVar24 * splitter - dVar24);
    dVar20 = dVar26 * splitter - (dVar26 * splitter - dVar26);
    dVar32 = dVar24 - dVar9;
    dVar33 = dVar26 - dVar20;
    dVar22 = dVar10 * dVar24;
    dVar23 = dVar11 * dVar26;
    dVar27 = dVar32 * dVar13 - (((dVar22 - dVar9 * dVar18) - dVar32 * dVar18) - dVar9 * dVar13);
    dVar28 = dVar33 * dVar16 - (((dVar23 - dVar20 * dVar19) - dVar33 * dVar19) - dVar20 * dVar16);
    dVar29 = dVar27 - dVar28;
    dVar21 = dVar22 + dVar29;
    dVar22 = (dVar22 - (dVar21 - (dVar21 - dVar22))) + (dVar29 - (dVar21 - dVar22));
    dVar25 = dVar22 - dVar23;
    adStack_178[0] = (dVar27 - (dVar29 + (dVar27 - dVar29))) + ((dVar27 - dVar29) - dVar28);
    adStack_178[3] = dVar21 + dVar25;
    adStack_178[1] = (dVar22 - (dVar25 + (dVar22 - dVar25))) + ((dVar22 - dVar25) - dVar23);
    adStack_178[2] =
         (dVar21 - (adStack_178[3] - (adStack_178[3] - dVar21))) +
         (dVar25 - (adStack_178[3] - dVar21));
    dVar9 = -dVar9;
    auVar3._8_4_ = SUB84(dVar20,0);
    auVar3._0_8_ = dVar9;
    auVar3._12_4_ = (uint)((ulong)dVar20 >> 0x20) ^ 0x80000000;
    lVar6 = 1;
    dVar20 = adStack_178[0];
    do {
      dVar20 = dVar20 + adStack_178[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    if ((dVar20 < ccwerrboundB * dVar8) && (-dVar20 < ccwerrboundB * dVar8)) {
      dVar21 = (dVar30 - (dVar24 + (dVar30 - dVar24))) + ((dVar30 - dVar24) - dVar15);
      dVar22 = (dVar31 - (dVar26 + (dVar31 - dVar26))) + ((dVar31 - dVar26) - dVar17);
      dVar30 = (dVar14 - (dVar10 + (dVar14 - dVar10))) + ((dVar14 - dVar10) - dVar17);
      dVar31 = (dVar7 - (dVar11 + (dVar7 - dVar11))) + ((dVar7 - dVar11) - dVar15);
      auVar1._4_4_ = -(uint)(dVar22 != 0.0);
      auVar1._0_4_ = -(uint)(dVar21 != 0.0);
      auVar1._8_4_ = -(uint)(dVar30 != 0.0);
      auVar1._12_4_ = -(uint)(dVar31 != 0.0);
      iVar5 = movmskps(4,auVar1);
      if (iVar5 != 0) {
        dVar8 = dVar8 * ccwerrboundC + ABS(dVar20) * resulterrbound;
        dVar10 = dVar10 * dVar21;
        dVar11 = dVar11 * dVar22;
        dVar24 = dVar24 * dVar30;
        dVar26 = dVar26 * dVar31;
        dVar20 = ((dVar24 + dVar10) - (dVar26 + dVar11)) + dVar20;
        if ((dVar20 < dVar8) && (-dVar20 < dVar8)) {
          dVar20 = splitter * dVar21 - (splitter * dVar21 - dVar21);
          dVar8 = splitter * dVar22 - (splitter * dVar22 - dVar22);
          dVar17 = dVar21 - dVar20;
          dVar15 = dVar22 - dVar8;
          auVar4._8_4_ = SUB84(dVar15,0);
          auVar4._0_8_ = dVar17;
          auVar4._12_4_ = (int)((ulong)dVar15 >> 0x20);
          auVar2._8_4_ = SUB84(dVar8,0);
          auVar2._0_8_ = dVar20;
          auVar2._12_4_ = (int)((ulong)dVar8 >> 0x20);
          dVar14 = dVar13 * dVar17 -
                   (((dVar10 - dVar20 * dVar18) - dVar18 * dVar17) - dVar20 * dVar13);
          dVar13 = dVar16 * dVar15 -
                   (((dVar11 - dVar8 * dVar19) - dVar19 * dVar15) - dVar8 * dVar16);
          dVar16 = dVar14 - dVar13;
          dVar7 = dVar10 + dVar16;
          dVar8 = (dVar10 - (dVar7 - (dVar7 - dVar10))) + (dVar16 - (dVar7 - dVar10));
          dVar15 = dVar8 - dVar11;
          dStack_158 = (dVar14 - (dVar16 + (dVar14 - dVar16))) + ((dVar14 - dVar16) - dVar13);
          dStack_150 = (dVar8 - (dVar15 + (dVar8 - dVar15))) + ((dVar8 - dVar15) - dVar11);
          adStack_140[0] = dVar7 + dVar15;
          dStack_148 = (dVar7 - (adStack_140[0] - (adStack_140[0] - dVar7))) +
                       (dVar15 - (adStack_140[0] - dVar7));
          iVar5 = fast_expansion_sum_zeroelim(4,adStack_178,4,&dStack_158,adStack_b8);
          dVar10 = dVar12 * dVar30;
          dVar12 = dVar12 * dVar31;
          dVar10 = dVar10 - (dVar10 - dVar30);
          dVar12 = dVar12 - (dVar12 - dVar31);
          dVar13 = dVar30 - dVar10;
          dVar16 = dVar31 - dVar12;
          dStack_190 = auVar3._8_8_;
          dVar15 = dVar32 * dVar13 - (dVar9 * dVar13 + -dVar32 * dVar10 + dVar9 * dVar10 + dVar24);
          dVar7 = dVar33 * dVar16 -
                  (dStack_190 * dVar16 + -dVar33 * dVar12 + dStack_190 * dVar12 + dVar26);
          dVar11 = dVar15 - dVar7;
          dVar14 = dVar24 + dVar11;
          dVar8 = (dVar24 - (dVar14 - (dVar14 - dVar24))) + (dVar11 - (dVar14 - dVar24));
          dVar9 = dVar8 - dVar26;
          dStack_158 = (dVar15 - (dVar11 + (dVar15 - dVar11))) + ((dVar15 - dVar11) - dVar7);
          dStack_150 = (dVar8 - (dVar9 + (dVar8 - dVar9))) + ((dVar8 - dVar9) - dVar26);
          adStack_140[0] = dVar14 + dVar9;
          dStack_148 = (dVar14 - (adStack_140[0] - (adStack_140[0] - dVar14))) +
                       (dVar9 - (adStack_140[0] - dVar14));
          iVar5 = fast_expansion_sum_zeroelim(iVar5,adStack_b8,4,&dStack_158,adStack_78);
          dVar30 = dVar30 * dVar21;
          dVar31 = dVar31 * dVar22;
          dStack_1a0 = auVar2._8_8_;
          dStack_1e0 = auVar4._8_8_;
          dVar15 = dVar13 * dVar17 -
                   (((dVar30 - dVar20 * dVar10) - dVar10 * dVar17) - dVar20 * dVar13);
          dVar17 = dVar16 * dStack_1e0 -
                   (((dVar31 - dStack_1a0 * dVar12) - dVar12 * dStack_1e0) - dStack_1a0 * dVar16);
          dVar9 = dVar15 - dVar17;
          dVar8 = dVar30 + dVar9;
          dVar20 = (dVar30 - (dVar8 - (dVar8 - dVar30))) + (dVar9 - (dVar8 - dVar30));
          dVar12 = dVar20 - dVar31;
          dStack_158 = (dVar15 - (dVar9 + (dVar15 - dVar9))) + ((dVar15 - dVar9) - dVar17);
          dStack_150 = (dVar20 - (dVar12 + (dVar20 - dVar12))) + ((dVar20 - dVar12) - dVar31);
          adStack_140[0] = dVar8 + dVar12;
          dStack_148 = (dVar8 - (adStack_140[0] - (adStack_140[0] - dVar8))) +
                       (dVar12 - (adStack_140[0] - dVar8));
          iVar5 = fast_expansion_sum_zeroelim(iVar5,adStack_78,4,&dStack_158,adStack_140 + 1);
          dVar20 = adStack_140[iVar5];
        }
      }
    }
    return dVar20;
  }
  return dVar20;
}

Assistant:

REAL orient2d(REAL *pa, REAL *pb, REAL *pc)
{
  REAL detleft, detright, det;
  REAL detsum, errbound;

  detleft = (pa[0] - pc[0]) * (pb[1] - pc[1]);
  detright = (pa[1] - pc[1]) * (pb[0] - pc[0]);
  det = detleft - detright;

  if (detleft > 0.0) {
    if (detright <= 0.0) {
      return det;
    } else {
      detsum = detleft + detright;
    }
  } else if (detleft < 0.0) {
    if (detright >= 0.0) {
      return det;
    } else {
      detsum = -detleft - detright;
    }
  } else {
    return det;
  }

  errbound = ccwerrboundA * detsum;
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  return orient2dadapt(pa, pb, pc, detsum);
}